

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffpkyt(fitsfile *fptr,char *keyname,long intval,double fraction,char *comm,int *status)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  char valstring [71];
  char fstring [71];
  char card [81];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if ((1.0 < fraction) || (fraction < 0.0)) {
    pcVar1 = "fraction must be between 0. and 1. (ffpkyt)";
  }
  else {
    ffi2c(intval,local_128,status);
    ffd2f(fraction,0x10,local_d8,status);
    pcVar1 = strchr(local_d8,0x2e);
    sVar2 = strlen(local_128);
    sVar3 = strlen(pcVar1);
    if (sVar3 + sVar2 < 0x47) {
      strcat(local_128,pcVar1);
      ffmkky(keyname,local_128,comm,local_88,status);
      ffprec(fptr,local_88,status);
      return *status;
    }
    pcVar1 = "converted numerical string too long";
  }
  ffpmsg(pcVar1);
  *status = 0x192;
  return 0x192;
}

Assistant:

int ffpkyt( fitsfile *fptr,      /* I - FITS file pointer        */
            const char  *keyname,/* I - name of keyword to write */
            long  intval,        /* I - integer part of value    */
            double fraction,     /* I - fractional part of value */
            const char  *comm,   /* I - keyword comment          */
            int   *status)       /* IO - error status            */
/*
  Write (put) a 'triple' precision keyword where the integer and
  fractional parts of the value are passed in separate parameters to
  increase the total amount of numerical precision.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD];
    char fstring[FLEN_VALUE], *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (fraction > 1. || fraction < 0.)
    {
        ffpmsg("fraction must be between 0. and 1. (ffpkyt)");
        return(*status = BAD_F2C);
    }

    ffi2c(intval, valstring, status);  /* convert integer to string */
    ffd2f(fraction, 16, fstring, status);  /* convert to 16 decimal string */

    cptr = strchr(fstring, '.');    /* find the decimal point */
    if (strlen(valstring)+strlen(cptr) > FLEN_VALUE-1)
    {
       ffpmsg("converted numerical string too long");
       return(*status=BAD_F2C);
    }
    strcat(valstring, cptr);    /* append the fraction to the integer */

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}